

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::
Own<kj::_::SplitBranch<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_0UL>_>
::dispose(Own<kj::_::SplitBranch<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_0UL>_>
          *this)

{
  SplitBranch<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_0UL>
  *object;
  SplitBranch<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_0UL>
  *ptrCopy;
  Own<kj::_::SplitBranch<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_0UL>_>
  *this_local;
  
  object = this->ptr;
  if (object != (SplitBranch<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_0UL>
                 *)0x0) {
    this->ptr = (SplitBranch<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>,_0UL>
                 *)0x0;
    Disposer::
    dispose<kj::_::SplitBranch<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,kj::Promise<kj::HttpClient::Response>>,0ul>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }